

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

void __thiscall wasm::MultiMemoryLowering::createMemorySizeFunctions(MultiMemoryLowering *this)

{
  uint uVar1;
  size_type sVar2;
  reference this_00;
  pointer pMVar3;
  pointer __x;
  ulong uVar4;
  Name memoryName;
  undefined1 local_20 [8];
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> function;
  Index i;
  MultiMemoryLowering *this_local;
  
  function._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)function._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_;
    sVar2 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::size(&this->wasm->memories);
    uVar1 = function._M_t.
            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_;
    if (sVar2 <= uVar4) break;
    this_00 = std::
              vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ::operator[](&this->wasm->memories,
                           (ulong)function._M_t.
                                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                  .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_
                          );
    pMVar3 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(this_00);
    memoryName.super_IString.str._M_len = (ulong)uVar1;
    memoryName.super_IString.str._M_str =
         (char *)(pMVar3->super_Importable).super_Named.name.super_IString.str._M_len;
    memorySize((MultiMemoryLowering *)local_20,(Index)this,memoryName);
    __x = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                    ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)local_20);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              (&this->memorySizeNames,(value_type *)__x);
    Module::addFunction(this->wasm,
                        (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)local_20
                       );
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)local_20);
    function._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ =
         function._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ + 1;
  }
  return;
}

Assistant:

void createMemorySizeFunctions() {
    for (Index i = 0; i < wasm->memories.size(); i++) {
      auto function = memorySize(i, wasm->memories[i]->name);
      memorySizeNames.push_back(function->name);
      wasm->addFunction(std::move(function));
    }
  }